

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.hpp
# Opt level: O2

void __thiscall cmdline::parser::parse_check(parser *this,int argc,char **argv)

{
  bool ok;
  size_type sVar1;
  allocator local_62;
  allocator local_61;
  key_type local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_60,"help",(allocator *)&local_40);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&local_60,"help",&local_61);
    std::__cxx11::string::string((string *)&local_40,"print this message",&local_62);
    add(this,&local_60,'?',&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  ok = parse(this,argc,argv);
  check(this,argc,ok);
  return;
}

Assistant:

void parse_check(int argc, char *argv[]) {
    if (!options.count("help")) add("help", '?', "print this message");
    check(argc, parse(argc, argv));
  }